

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

shared_ptr<cppnet::BlockMemoryPool> __thiscall
cppnet::BufferQueue::GetBlockMemoryPool(BufferQueue *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cppnet::BlockMemoryPool> sVar1;
  BufferQueue *this_local;
  
  std::shared_ptr<cppnet::BlockMemoryPool>::shared_ptr
            ((shared_ptr<cppnet::BlockMemoryPool> *)this,
             (shared_ptr<cppnet::BlockMemoryPool> *)(in_RSI + 0x48));
  sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BlockMemoryPool>)
         sVar1.super___shared_ptr<cppnet::BlockMemoryPool,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BlockMemoryPool> BufferQueue::GetBlockMemoryPool() {
    return _block_alloter;
}